

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,unsigned_char>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,uchar *c_rhs)

{
  ulong uVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar4;
  
  switch(t_oper) {
  case equals:
    b = *c_lhs == (ulong)*c_rhs;
    goto LAB_0037ebb1;
  case less_than:
    b = *c_lhs < (ulong)*c_rhs;
    goto LAB_0037ebb1;
  case greater_than:
    b = (ulong)*c_rhs < *c_lhs;
    goto LAB_0037ebb1;
  case less_than_equal:
    b = *c_lhs <= (ulong)*c_rhs;
    goto LAB_0037ebb1;
  case greater_than_equal:
    b = (ulong)*c_rhs <= *c_lhs;
    goto LAB_0037ebb1;
  case not_equal:
    b = *c_lhs != (ulong)*c_rhs;
LAB_0037ebb1:
    BVar4 = const_var((chaiscript *)this,b);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_0037ebd4;
  default:
    if (t_lhs == (unsigned_long *)0x0) {
switchD_0037ec2a_caseD_7:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__bad_cast_0046dff0;
      __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    switch(t_oper) {
    case assign:
      uVar1 = (ulong)*c_rhs;
      goto LAB_0037ecab;
    default:
      goto switchD_0037ec2a_caseD_7;
    case assign_product:
      uVar1 = (ulong)*c_rhs * *t_lhs;
      goto LAB_0037ecab;
    case assign_sum:
      *t_lhs = *t_lhs + (ulong)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_char>(*c_rhs);
      uVar1 = *t_lhs / (ulong)*c_rhs;
      goto LAB_0037ecab;
    case assign_difference:
      *t_lhs = *t_lhs - (ulong)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_char>(*c_rhs);
      uVar1 = (ulong)((uint)*c_rhs & (uint)*t_lhs);
LAB_0037ecab:
      *t_lhs = uVar1;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (ulong)*c_rhs;
      break;
    case assign_shift_left:
      *t_lhs = *t_lhs << (*c_rhs & 0x3f);
      break;
    case assign_shift_right:
      *t_lhs = *t_lhs >> (*c_rhs & 0x3f);
      break;
    case assign_remainder:
      *t_lhs = *t_lhs % (ulong)*c_rhs;
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (ulong)*c_rhs;
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
    _Var3._M_pi = extraout_RDX;
    goto LAB_0037ebd4;
  case shift_left:
    break;
  case shift_right:
    break;
  case remainder:
    check_divide_by_zero<unsigned_char>(*c_rhs);
    break;
  case bitwise_and:
    break;
  case bitwise_or:
    break;
  case bitwise_xor:
    break;
  case sum:
    break;
  case quotient:
    check_divide_by_zero<unsigned_char>(*c_rhs);
    break;
  case product:
    break;
  case difference:
  }
  BVar4 = detail::const_var_impl<unsigned_long>((unsigned_long *)this);
  _Var3._M_pi = BVar4.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_0037ebd4:
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }